

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  uint uVar2;
  size_t __size;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *__ptr_01;
  unsigned_short *__ptr_02;
  int *__ptr_03;
  unsigned_short *__ptr_04;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  size_t sVar10;
  byte bVar11;
  uint extraout_EDX;
  uint value;
  uint extraout_EDX_00;
  size_t sVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint *puVar23;
  LodePNGCompressSettings *pLVar24;
  bool bVar25;
  bool bVar26;
  size_t local_258;
  LodePNGCompressSettings *local_250;
  ucvector v;
  HuffmanTree tree_ll;
  uivector bitlen_lld_e;
  HuffmanTree tree_d;
  uivector lz77_encoded;
  uivector local_138;
  HuffmanTree tree_cl;
  uivector bitlen_lld;
  uivector frequencies_cl;
  uivector frequencies_d;
  uivector frequencies_ll;
  Hash local_60;
  
  v.data = *out;
  v.size = *outsize;
  local_258 = 0;
  uVar20 = settings->btype;
  if (uVar20 < 3) {
    sVar19 = insize;
    v.allocsize = v.size;
    if (uVar20 != 1) {
      if (uVar20 == 0) {
        uVar20 = 0;
        uVar6 = (insize + 0xfffe) / 0xffff;
        local_250 = (LodePNGCompressSettings *)(uVar6 - 1);
        for (uVar18 = 0; uVar18 != uVar6; uVar18 = uVar18 + 1) {
          ucvector_push_back(&v,(LodePNGCompressSettings *)uVar18 == local_250);
          iVar13 = (int)insize - uVar20;
          if (0xfffe < insize - uVar20) {
            iVar13 = 0xffff;
          }
          ucvector_push_back(&v,(uchar)iVar13);
          ucvector_push_back(&v,(uchar)((uint)iVar13 >> 8));
          ucvector_push_back(&v,(uchar)(0xffff - iVar13));
          ucvector_push_back(&v,(uchar)((uint)(0xffff - iVar13) >> 8));
          for (uVar14 = 0;
              (uVar14 < 0xffff && (uVar17 = (ulong)(uVar20 + (int)uVar14), uVar17 < insize));
              uVar14 = uVar14 + 1) {
            ucvector_push_back(&v,in[uVar17]);
          }
          uVar20 = uVar20 + (int)uVar14;
        }
        uVar20 = 0;
        goto LAB_004ba572;
      }
      uVar6 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar6 = insize >> 3;
      }
      if (0x3fff7 < uVar6) {
        uVar6 = 0x3fff8;
      }
      sVar19 = uVar6 + 8;
    }
    uVar6 = 1;
    if (!CARRY8(insize - 1,sVar19)) {
      uVar6 = ((insize - 1) + sVar19) / sVar19;
    }
    uVar18 = (ulong)settings->windowsize;
    local_250 = settings;
    __ptr = (int *)malloc(0x40000);
    local_60.head = __ptr;
    __ptr_00 = (int *)malloc(uVar18 * 4);
    __size = uVar18 * 2;
    local_60.val = __ptr_00;
    __ptr_01 = (unsigned_short *)malloc(__size);
    local_60.chain = __ptr_01;
    __ptr_02 = (unsigned_short *)malloc(__size);
    local_60.zeros = __ptr_02;
    __ptr_03 = (int *)malloc(0x40c);
    local_60.headz = __ptr_03;
    __ptr_04 = (unsigned_short *)malloc(__size);
    uVar20 = 0x53;
    if (((((__ptr_00 != (int *)0x0) && (__ptr != (int *)0x0)) && (__ptr_01 != (unsigned_short *)0x0)
         ) && ((__ptr_02 != (unsigned_short *)0x0 && (__ptr_03 != (int *)0x0)))) &&
       (__ptr_04 != (unsigned_short *)0x0)) {
      for (lVar7 = 0; lVar7 != 0x10000; lVar7 = lVar7 + 1) {
        __ptr[lVar7] = -1;
      }
      for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
        __ptr_00[uVar14] = -1;
      }
      for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
        __ptr_01[uVar14] = (unsigned_short)uVar14;
      }
      for (lVar7 = 0; lVar7 != 0x103; lVar7 = lVar7 + 1) {
        __ptr_03[lVar7] = -1;
      }
      for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
        __ptr_04[uVar14] = (unsigned_short)uVar14;
      }
      uVar18 = 0;
      uVar20 = 0;
      pLVar24 = local_250;
      local_60.chainz = __ptr_04;
LAB_004b9b1b:
      if ((uVar18 != uVar6) && (uVar20 == 0)) {
        bVar26 = uVar18 == uVar6 - 1;
        uVar17 = uVar18 * sVar19;
        uVar14 = uVar17 + sVar19;
        if (insize <= uVar17 + sVar19) {
          uVar14 = insize;
        }
        if (pLVar24->btype == 2) {
          lz77_encoded.allocsize = 0;
          tree_ll.lengths = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_cl.lengths = (uint *)0x0;
          frequencies_ll.allocsize = 0;
          frequencies_d.allocsize = 0;
          frequencies_cl.allocsize = 0;
          bitlen_lld.allocsize = 0;
          bitlen_lld_e.allocsize = 0;
          local_138.allocsize = 0;
          lz77_encoded.data = (uint *)0x0;
          lz77_encoded.size = 0;
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          tree_cl.tree2d = (uint *)0x0;
          tree_cl.tree1d = (uint *)0x0;
          frequencies_ll.data = (uint *)0x0;
          frequencies_ll.size = 0;
          frequencies_d.data = (uint *)0x0;
          frequencies_d.size = 0;
          frequencies_cl.data = (uint *)0x0;
          frequencies_cl.size = 0;
          bitlen_lld.data = (uint *)0x0;
          bitlen_lld.size = 0;
          bitlen_lld_e.data = (uint *)0x0;
          bitlen_lld_e.size = 0;
          local_138.data = (uint *)0x0;
          local_138.size = 0;
          if (pLVar24->use_lz77 == 0) {
            uVar5 = uivector_resize(&lz77_encoded,uVar14 - uVar17);
            uVar20 = 0x53;
            puVar8 = lz77_encoded.data;
            if (uVar5 != 0) {
              for (; uVar5 = extraout_EDX_00, uVar17 < uVar14; uVar17 = uVar17 + 1) {
                *puVar8 = (uint)in[uVar17];
                puVar8 = puVar8 + 1;
              }
              goto LAB_004b9db4;
            }
          }
          else {
            uVar20 = encodeLZ77(&lz77_encoded,&local_60,in,uVar17,uVar14,pLVar24->windowsize,
                                pLVar24->minmatch,pLVar24->nicematch,pLVar24->lazymatching);
            uVar5 = extraout_EDX;
            if (uVar20 == 0) {
LAB_004b9db4:
              uVar5 = uivector_resizev(&frequencies_ll,0x11e,uVar5);
              uVar20 = 0x53;
              if (uVar5 != 0) {
                uVar5 = uivector_resizev(&frequencies_d,0x1e,value);
                puVar8 = frequencies_d.data;
                uVar20 = 0x53;
                if (uVar5 != 0) {
                  for (sVar12 = 0; sVar12 != lz77_encoded.size; sVar12 = sVar12 + 1) {
                    uVar20 = lz77_encoded.data[sVar12];
                    frequencies_ll.data[uVar20] = frequencies_ll.data[uVar20] + 1;
                    if (0x100 < (ulong)uVar20) {
                      lVar7 = sVar12 + 2;
                      sVar12 = sVar12 + 3;
                      frequencies_d.data[lz77_encoded.data[lVar7]] =
                           frequencies_d.data[lz77_encoded.data[lVar7]] + 1;
                    }
                  }
                  frequencies_ll.data[0x100] = 1;
                  uVar20 = HuffmanTree_makeFromFrequencies
                                     (&tree_ll,frequencies_ll.data,0x101,frequencies_ll.size,0xf);
                  if ((uVar20 == 0) &&
                     (uVar20 = HuffmanTree_makeFromFrequencies
                                         (&tree_d,puVar8,2,frequencies_d.size,0xf),
                     uVar5 = tree_d.numcodes, puVar8 = tree_ll.lengths, uVar20 == 0)) {
                    uVar2 = tree_ll.numcodes;
                    if (0x11d < tree_ll.numcodes) {
                      uVar2 = 0x11e;
                    }
                    uVar14 = extraout_RDX;
                    for (uVar17 = 0; puVar23 = tree_d.lengths, uVar2 != uVar17; uVar17 = uVar17 + 1)
                    {
                      uivector_push_back(&bitlen_lld,puVar8[uVar17]);
                      uVar14 = extraout_RDX_00;
                    }
                    uVar17 = (ulong)uVar5;
                    if (0x1d < uVar5) {
                      uVar17 = 0x1e;
                    }
                    for (uVar21 = 0; puVar4 = bitlen_lld.data, uVar17 != uVar21; uVar21 = uVar21 + 1
                        ) {
                      uivector_push_back(&bitlen_lld,puVar23[uVar21]);
                      uVar14 = extraout_RDX_01;
                    }
                    uVar21 = bitlen_lld.size & 0xffffffff;
                    for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
                      uVar20 = puVar4[uVar22];
                      uVar5 = 0;
                      while( true ) {
                        uVar15 = (ulong)uVar5;
                        uVar14 = uVar22 + 1 + uVar15;
                        if ((uVar21 <= uVar14) || (puVar4[uVar14] != uVar20)) break;
                        uVar5 = uVar5 + 1;
                      }
                      if ((uVar20 == 0) && (1 < uVar5)) {
                        uVar20 = uVar5 + 1;
                        if (uVar20 < 0xb) {
                          uivector_push_back(&bitlen_lld_e,0x11);
                          uivector_push_back(&bitlen_lld_e,uVar5 - 2);
                          uVar14 = extraout_RDX_02;
                        }
                        else {
                          if (0x89 < uVar20) {
                            uVar20 = 0x8a;
                          }
                          uivector_push_back(&bitlen_lld_e,0x12);
                          uivector_push_back(&bitlen_lld_e,uVar20 - 0xb);
                          uVar15 = (ulong)(uVar20 - 1);
                          uVar14 = extraout_RDX_06;
                        }
LAB_004ba210:
                        uVar22 = uVar22 + uVar15;
                      }
                      else {
                        uivector_push_back(&bitlen_lld_e,uVar20);
                        uVar14 = extraout_RDX_03;
                        if (2 < uVar5) {
                          uVar9 = uVar15 / 6;
                          uVar14 = uVar15 % 6;
                          while (bVar25 = uVar9 != 0, uVar9 = uVar9 - 1, bVar25) {
                            uivector_push_back(&bitlen_lld_e,0x10);
                            uivector_push_back(&bitlen_lld_e,3);
                            uVar14 = extraout_RDX_04;
                          }
                          if (uVar5 % 6 < 3) {
                            uVar15 = (ulong)(uVar5 - uVar5 % 6);
                            pLVar24 = local_250;
                          }
                          else {
                            uivector_push_back(&bitlen_lld_e,0x10);
                            uivector_push_back(&bitlen_lld_e,(uVar5 - 3) + (uVar5 / 6) * -6);
                            uVar14 = extraout_RDX_05;
                            pLVar24 = local_250;
                          }
                          goto LAB_004ba210;
                        }
                      }
                    }
                    uVar5 = uivector_resizev(&frequencies_cl,0x13,(uint)uVar14);
                    sVar12 = bitlen_lld_e.size;
                    puVar23 = bitlen_lld_e.data;
                    uVar20 = 0x53;
                    if (uVar5 != 0) {
                      for (sVar10 = 0; sVar10 != bitlen_lld_e.size;
                          sVar10 = (sVar10 - (bitlen_lld_e.data[sVar10] < 0x10)) + 2) {
                        frequencies_cl.data[bitlen_lld_e.data[sVar10]] =
                             frequencies_cl.data[bitlen_lld_e.data[sVar10]] + 1;
                      }
                      uVar20 = HuffmanTree_makeFromFrequencies
                                         (&tree_cl,frequencies_cl.data,frequencies_cl.size,
                                          frequencies_cl.size,7);
                      if (uVar20 == 0) {
                        uVar14 = (ulong)tree_cl.numcodes;
                        uVar5 = uivector_resize(&local_138,uVar14);
                        puVar4 = tree_cl.lengths;
                        uVar20 = 0x53;
                        if (uVar5 != 0) {
                          for (lVar7 = 0; uVar14 << 2 != lVar7; lVar7 = lVar7 + 4) {
                            *(uint *)((long)local_138.data + lVar7) =
                                 tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar7)];
                          }
                          do {
                            sVar16 = local_138.size;
                            puVar1 = local_138.data;
                            sVar10 = local_258;
                            if ((local_138.size < 5) || (local_138.data[local_138.size - 1] != 0)) {
                              if ((local_258 & 7) == 0) {
                                ucvector_push_back(&v,'\0');
                              }
                              v.data[v.size - 1] = v.data[v.size - 1] | bVar26 << ((byte)sVar10 & 7)
                              ;
                              if (((int)sVar10 + 1U & 7) == 0) {
                                ucvector_push_back(&v,'\0');
                              }
                              if ((sVar10 + 2 & 7) == 0) {
                                ucvector_push_back(&v,'\0');
                              }
                              local_258 = sVar10 + 3;
                              uVar20 = (int)sVar16 - 3;
                              v.data[v.size - 1] =
                                   v.data[v.size - 1] | '\x01' << ((byte)(sVar10 + 2) & 7);
                              uVar14 = (ulong)((int)sVar16 - 4) + 3;
                              goto LAB_004ba3ba;
                            }
                            uVar20 = uivector_resize(&local_138,local_138.size - 1);
                          } while (uVar20 != 0);
                          uVar20 = 0x53;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_004b9fa0;
        }
        uVar20 = 0;
        if (pLVar24->btype == 1) {
          tree_ll.lengths = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&tree_d);
          sVar12 = local_258;
          if ((local_258 & 7) == 0) {
            ucvector_push_back(&v,'\0');
          }
          bVar11 = bVar26 << ((byte)sVar12 & 7) | v.data[v.size - 1];
          v.data[v.size - 1] = bVar11;
          if ((sVar12 + 1 & 7) == 0) {
            ucvector_push_back(&v,'\0');
            bVar11 = v.data[v.size - 1];
          }
          v.data[v.size - 1] = '\x01' << ((byte)(sVar12 + 1) & 7) | bVar11;
          if (((int)sVar12 + 2U & 7) == 0) {
            ucvector_push_back(&v,'\0');
          }
          puVar23 = tree_ll.lengths;
          puVar8 = tree_ll.tree1d;
          local_258 = sVar12 + 3;
          if (pLVar24->use_lz77 == 0) {
            for (; uVar17 < uVar14; uVar17 = uVar17 + 1) {
              addHuffmanSymbol(&local_258,&v,puVar8[in[uVar17]],puVar23[in[uVar17]]);
            }
LAB_004b9f05:
            addHuffmanSymbol(&local_258,&v,puVar8[0x100],puVar23[0x100]);
            uVar20 = 0;
            pLVar24 = local_250;
          }
          else {
            tree_cl.lengths = (uint *)0x0;
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            uVar20 = encodeLZ77((uivector *)&tree_cl,&local_60,in,uVar17,uVar14,pLVar24->windowsize,
                                pLVar24->minmatch,pLVar24->nicematch,pLVar24->lazymatching);
            if (uVar20 == 0) {
              writeLZ77data(&local_258,&v,(uivector *)&tree_cl,&tree_ll,&tree_d);
              uivector_cleanup(&tree_cl);
              puVar8 = tree_ll.tree1d;
              puVar23 = tree_ll.lengths;
              goto LAB_004b9f05;
            }
            uivector_cleanup(&tree_cl);
          }
          HuffmanTree_cleanup(&tree_ll);
          HuffmanTree_cleanup(&tree_d);
        }
        goto LAB_004ba034;
      }
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      free(__ptr_02);
      free(__ptr_03);
      free(__ptr_04);
    }
  }
  else {
    uVar20 = 0x3d;
  }
LAB_004ba572:
  *out = v.data;
  *outsize = v.size;
  return uVar20;
  while( true ) {
    uVar22 = uVar14 & 0xffffffff;
    uVar14 = uVar14 - 1;
    sVar16 = (size_t)((int)sVar16 - 1);
    if (puVar1[uVar22] != 0) break;
LAB_004ba3ba:
    uVar20 = uVar20 - 1;
    uVar21 = sVar16 & 0xffffffff;
    if (uVar14 == 3) break;
  }
  addBitsToStream(&local_258,&v,uVar2 - 0x101,5);
  addBitsToStream(&local_258,&v,(int)uVar17 - 1,5);
  addBitsToStream(&local_258,&v,uVar20,4);
  for (uVar14 = 0; puVar3 = tree_cl.tree1d, uVar21 != uVar14; uVar14 = uVar14 + 1) {
    addBitsToStream(&local_258,&v,puVar1[uVar14],3);
  }
  for (sVar10 = 0; sVar10 != sVar12; sVar10 = sVar10 + 1) {
    addHuffmanSymbol(&local_258,&v,puVar3[puVar23[sVar10]],puVar4[puVar23[sVar10]]);
    puVar1 = puVar23 + sVar10;
    if (*puVar1 - 0x10 < 3) {
      lVar7 = sVar10 + 1;
      sVar10 = sVar10 + 1;
      addBitsToStream(&local_258,&v,puVar23[lVar7],
                      *(size_t *)(&DAT_009f4a40 + (ulong)(*puVar1 - 0x10) * 8));
    }
  }
  writeLZ77data(&local_258,&v,&lz77_encoded,&tree_ll,&tree_d);
  pLVar24 = local_250;
  uVar5 = puVar8[0x100];
  uVar20 = 0x40;
  if (uVar5 != 0) {
    addHuffmanSymbol(&local_258,&v,tree_ll.tree1d[0x100],uVar5);
    uVar20 = 0;
  }
LAB_004b9fa0:
  uivector_cleanup(&lz77_encoded);
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);
  HuffmanTree_cleanup(&tree_cl);
  uivector_cleanup(&frequencies_ll);
  uivector_cleanup(&frequencies_d);
  uivector_cleanup(&frequencies_cl);
  uivector_cleanup(&bitlen_lld_e);
  uivector_cleanup(&bitlen_lld);
  uivector_cleanup(&local_138);
LAB_004ba034:
  uVar18 = uVar18 + 1;
  goto LAB_004b9b1b;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}